

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::optimizeRelational(OptimizeInstructions *this,Binary *curr)

{
  Id IVar1;
  Binary *left;
  Binary *pBVar2;
  Type TVar3;
  Const *leftConst;
  bool bVar4;
  bool bVar5;
  BinaryOp BVar6;
  BinaryOp BVar7;
  Index IVar8;
  uint uVar9;
  Index IVar10;
  Expression *pEVar11;
  undefined *puVar12;
  int64_t iVar13;
  Literal *this_00;
  Binary *right;
  Binary *rightConst;
  OptimizeInstructions *pOVar14;
  Literal local_210;
  Literal local_1f8;
  Literal local_1e0;
  Literal local_1c8;
  undefined1 local_1b0 [8];
  Const *c1;
  undefined1 local_1a0 [8];
  Binary *add;
  undefined1 local_190 [8];
  Literal C1;
  undefined1 local_148 [8];
  Literal C1SubC2;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_128;
  undefined1 local_110 [8];
  Literal C2;
  undefined1 local_c8 [8];
  Literal C2SubC1;
  undefined1 local_a0 [8];
  Literal zero;
  anon_union_16_6_1532cd5a_for_Literal_0 local_78;
  OptimizeInstructions *local_60;
  anon_union_16_6_1532cd5a_for_Literal_0 local_58;
  long local_40;
  Binary *inner;
  
  left = (Binary *)curr->left;
  if (((left->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id &
      0xfffffffffffffffe) != 2) {
    return (Expression *)0x0;
  }
  pBVar2 = (Binary *)curr->right;
  TVar3.id = (pBVar2->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  local_60 = this;
  if (6 < TVar3.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  if ((((curr->op == *(BinaryOp *)(&DAT_00df9190 + TVar3.id * 4)) ||
       (curr->op == *(BinaryOp *)(&DAT_00df9174 + TVar3.id * 4))) &&
      ((left->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId))
     && ((left->op == *(BinaryOp *)(&DAT_00df9300 + TVar3.id * 4) &&
         (leftConst = (Const *)left->right,
         (leftConst->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id ==
         ConstId)))) {
    IVar1 = (pBVar2->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id;
    if (IVar1 == BinaryId) {
      inner._4_4_ = pBVar2->op;
      BVar6 = Abstract::getBinary(TVar3,Add);
      if ((inner._4_4_ == BVar6) &&
         (rightConst = (Binary *)pBVar2->right, right = pBVar2,
         (rightConst->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
         ConstId)) goto LAB_009dbecf;
    }
    else if (IVar1 == ConstId) {
      right = (Binary *)0x0;
      rightConst = pBVar2;
LAB_009dbecf:
      pEVar11 = combineRelationalConstants(local_60,curr,left,leftConst,right,(Const *)rightConst);
      return pEVar11;
    }
  }
  C1SubC2.field_0.func.super_IString.str._M_str = local_c8;
  local_c8 = (undefined1  [8])0x0;
  C1SubC2.type.id = (uintptr_t)local_a0;
  local_a0 = (undefined1  [8])0x0;
  local_148 = (undefined1  [8])&local_40;
  C1SubC2.field_0.i32 = 4;
  C1.field_0.func.super_IString.str._M_str = (char *)0x0;
  local_190 = (undefined1  [8])0x0;
  local_110 = (undefined1  [8])0x0;
  C2.field_0.i32 = 0x1b;
  if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
      && (BVar6 = curr->op, C2.field_0.func.super_IString.str._M_str = local_148,
         C2.type.id = (uintptr_t)local_190,
         BVar7 = Abstract::getBinary((Type)(curr->left->type).id,GtU), BVar6 == BVar7)) &&
     (bVar4 = Match::Internal::
              Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                            *)&C2.field_0.func.super_IString.str._M_str), bVar4)) {
    puVar12 = &DAT_00df9174;
  }
  else {
    local_c8 = (undefined1  [8])0x0;
    local_a0 = (undefined1  [8])0x0;
    local_148 = (undefined1  [8])&local_40;
    C1SubC2.field_0.i32 = 4;
    C1SubC2.type.id = (uintptr_t)local_a0;
    C1.field_0.func.super_IString.str._M_str = (char *)0x0;
    local_190 = (undefined1  [8])0x0;
    local_110 = (undefined1  [8])0x0;
    C2.field_0.i32 = 0x19;
    C1SubC2.field_0.func.super_IString.str._M_str = local_c8;
    if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id !=
          BinaryId) ||
        (BVar6 = curr->op, C2.field_0.func.super_IString.str._M_str = local_148,
        C2.type.id = (uintptr_t)local_190,
        BVar7 = Abstract::getBinary((Type)(curr->left->type).id,LeU), BVar6 != BVar7)) ||
       (bVar4 = Match::Internal::
                Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                              *)&C2.field_0.func.super_IString.str._M_str), !bVar4)) {
      C2SubC1.field_0.func.super_IString.str._M_str = (char *)&local_58;
      local_58.i64 = 0;
      C2SubC1.type.id = (uintptr_t)&local_78;
      local_78.i64 = 0;
      local_c8 = (undefined1  [8])&local_40;
      C2SubC1.field_0.i32 = 4;
      C1.field_0.func.super_IString.str._M_str = (char *)0x0;
      local_190 = (undefined1  [8])0x0;
      local_110 = (undefined1  [8])0x0;
      C2.field_0.i32 = 0x14;
      C2.type.id = (uintptr_t)local_190;
      if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
            BinaryId) &&
          (BVar6 = curr->op, C2.field_0.func.super_IString.str._M_str = local_c8,
          BVar7 = Abstract::getBinary((Type)(curr->left->type).id,Eq), BVar6 == BVar7)) &&
         (bVar4 = Match::Internal::
                  Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                  ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                                *)&C2.field_0.func.super_IString.str._M_str), bVar4))
      goto LAB_009dc1d2;
      zero.field_0.func.super_IString.str._M_str = local_1a0;
      local_1a0 = (undefined1  [8])0x0;
      local_1b0 = (undefined1  [8])0x0;
      local_a0 = (undefined1  [8])&local_40;
      zero.field_0.i32 = 4;
      C2.field_0.func.super_IString.str._M_str = (char *)0x0;
      local_110 = (undefined1  [8])0x0;
      local_148 = (undefined1  [8])0x0;
      C1SubC2.field_0.i32 = 0x15;
      C1SubC2.field_0.func.super_IString.str._M_str = local_a0;
      C1SubC2.type.id = (uintptr_t)local_110;
      zero.type.id = (uintptr_t)local_1b0;
      if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
            BinaryId) &&
          (BVar6 = curr->op, BVar7 = Abstract::getBinary((Type)(curr->left->type).id,Ne),
          BVar6 == BVar7)) &&
         (bVar4 = Match::Internal::
                  Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                  ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                                *)&C1SubC2.field_0.func.super_IString.str._M_str), bVar4))
      goto LAB_009dc1d2;
      local_c8 = (undefined1  [8])local_1a0;
      local_a0 = (undefined1  [8])0x0;
      C1.field_0.func.super_IString.str._M_str = (char *)0x0;
      C2SubC1.field_0.i32 = 3;
      C2SubC1.field_0.func.super_IString.str._M_str = local_a0;
      C2.field_0.func.super_IString.str._M_str = (char *)0x0;
      local_110 = (undefined1  [8])&local_40;
      local_148 = (undefined1  [8])0x0;
      C1SubC2.field_0.func.super_IString.str._M_str = (char *)0x0;
      local_128.curr =
           (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            *)local_c8;
      pOVar14 = local_60;
      local_190 = (undefined1  [8])local_1b0;
      local_128.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
            *)local_110;
      C2SubC1.type.id = (uintptr_t)local_190;
      if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
            BinaryId) &&
          (bVar4 = Match::Internal::
                   Components<wasm::Binary_*,_1,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                   ::match(curr,&local_128), pOVar14 = local_60, bVar4)) &&
         (bVar4 = canOverflow(local_60,(Binary *)local_1a0,
                              (bool)((byte)(0x1540000aa0000 >> ((byte)curr->op & 0x3f)) &
                                    curr->op < GeUInt64)), !bVar4)) {
        Literal::Literal((Literal *)local_190,(Literal *)((long)local_1b0 + 0x10));
        Literal::Literal((Literal *)local_110,(Literal *)(local_40 + 0x10));
        Literal::sub((Literal *)local_148,(Literal *)local_190,(Literal *)local_110);
        Literal::sub((Literal *)local_c8,(Literal *)local_110,(Literal *)local_190);
        Literal::makeZero((Literal *)local_a0,
                          (Type)(((SpecificExpression<(wasm::Expression::Id)16> *)local_1a0)->
                                super_Expression).type.id);
        bVar5 = Literal::operator!=((Literal *)local_190,(Literal *)local_a0);
        bVar4 = true;
        if ((bVar5) &&
           (bVar5 = Literal::operator!=((Literal *)local_110,(Literal *)local_a0), bVar5)) {
          if (((ulong)curr->op < 0x31) && ((0x1540000aa0000U >> ((ulong)curr->op & 0x3f) & 1) != 0))
          {
            Literal::leS((Literal *)&local_58.func,(Literal *)local_c8,(Literal *)local_110);
            iVar13 = Literal::getInteger((Literal *)&local_58.func);
            if (iVar13 == 0) {
              Literal::~Literal((Literal *)&local_58.func);
LAB_009dc5d8:
              Literal::leS((Literal *)&local_58.func,(Literal *)local_148,(Literal *)local_190);
              iVar13 = Literal::getInteger((Literal *)&local_58.func);
              if (iVar13 == 0) {
                Literal::~Literal((Literal *)&local_58.func);
              }
              else {
                Literal::leS((Literal *)&local_78.func,(Literal *)local_a0,(Literal *)local_110);
                iVar13 = Literal::getInteger((Literal *)&local_78.func);
                Literal::~Literal((Literal *)&local_78.func);
                Literal::~Literal((Literal *)&local_58.func);
                if (iVar13 != 0) goto LAB_009dc792;
              }
              goto LAB_009dc7c0;
            }
            Literal::leS((Literal *)&local_78.func,(Literal *)local_a0,(Literal *)local_190);
            iVar13 = Literal::getInteger((Literal *)&local_78.func);
            Literal::~Literal((Literal *)&local_78.func);
            Literal::~Literal((Literal *)&local_58.func);
            if (iVar13 == 0) goto LAB_009dc5d8;
LAB_009dc3e9:
            Literal::operator=((Literal *)(local_40 + 0x10),(Literal *)local_c8);
            curr->left = *(Expression **)((long)local_1a0 + 0x18);
          }
          else {
            Literal::leU((Literal *)&local_58.func,(Literal *)local_c8,(Literal *)local_110);
            iVar13 = Literal::getInteger((Literal *)&local_58.func);
            if (iVar13 == 0) {
              Literal::~Literal((Literal *)&local_58.func);
            }
            else {
              Literal::leU((Literal *)&local_78.func,(Literal *)local_a0,(Literal *)local_190);
              iVar13 = Literal::getInteger((Literal *)&local_78.func);
              Literal::~Literal((Literal *)&local_78.func);
              Literal::~Literal((Literal *)&local_58.func);
              if (iVar13 != 0) goto LAB_009dc3e9;
            }
            Literal::leU((Literal *)&local_58.func,(Literal *)local_148,(Literal *)local_190);
            iVar13 = Literal::getInteger((Literal *)&local_58.func);
            if (iVar13 == 0) {
              Literal::~Literal((Literal *)&local_58.func);
LAB_009dc8d3:
              __assert_fail("doC2SubC1 || doC1SubC2",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                            ,0x1232,
                            "Expression *wasm::OptimizeInstructions::optimizeRelational(Binary *)");
            }
            Literal::leU((Literal *)&local_78.func,(Literal *)local_a0,(Literal *)local_110);
            iVar13 = Literal::getInteger((Literal *)&local_78.func);
            Literal::~Literal((Literal *)&local_78.func);
            Literal::~Literal((Literal *)&local_58.func);
            if (iVar13 == 0) goto LAB_009dc8d3;
LAB_009dc792:
            Literal::operator=((Literal *)((long)local_1b0 + 0x10),(Literal *)local_148);
            Literal::operator=((Literal *)(local_40 + 0x10),(Literal *)local_a0);
          }
          bVar4 = false;
        }
LAB_009dc7c0:
        Literal::~Literal((Literal *)local_a0);
        Literal::~Literal((Literal *)local_c8);
        Literal::~Literal((Literal *)local_148);
        Literal::~Literal((Literal *)local_110);
        Literal::~Literal((Literal *)local_190);
        if (!bVar4) {
          return (Expression *)curr;
        }
      }
      IVar8 = Bits::getMaxBits<wasm::OptimizeInstructions>(curr->left,pOVar14);
      TVar3.id = (curr->left->type).id;
      uVar9 = 0xffffffff;
      local_190 = (undefined1  [8])TVar3.id;
      if (TVar3.id - 2 < 5) {
        uVar9 = wasm::Type::getByteSize((Type *)local_190);
        uVar9 = uVar9 << 3;
      }
      IVar10 = 0;
      if (IVar8 < uVar9) {
        if (curr->right->_id == ConstId) {
          IVar10 = Bits::getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                             (curr->right,(DummyLocalInfoProvider *)0x0);
        }
        uVar9 = 0xffffffff;
        local_190 = (undefined1  [8])TVar3.id;
        if (TVar3.id - 2 < 5) {
          uVar9 = wasm::Type::getByteSize((Type *)local_190);
          uVar9 = uVar9 << 3;
        }
        pOVar14 = local_60;
        if (IVar8 < IVar10) {
          BVar6 = curr->op;
          inner._4_4_ = uVar9;
          BVar7 = Abstract::getBinary(TVar3,Eq);
          if ((((BVar6 == BVar7) ||
               (BVar6 = curr->op, BVar7 = Abstract::getBinary(TVar3,GtU), BVar6 == BVar7)) ||
              (BVar6 = curr->op, BVar7 = Abstract::getBinary(TVar3,GeU), BVar6 == BVar7)) ||
             ((IVar10 != inner._4_4_ &&
              ((BVar6 = curr->op, BVar7 = Abstract::getBinary(TVar3,GtS), BVar6 == BVar7 ||
               (BVar6 = curr->op, BVar7 = Abstract::getBinary(TVar3,GeS), BVar6 == BVar7)))))) {
            Literal::makeZero(&local_210,(Type)0x2);
            pEVar11 = getDroppedChildrenAndAppend(pOVar14,(Expression *)curr,&local_210);
            this_00 = &local_210;
          }
          else {
            BVar6 = curr->op;
            BVar7 = Abstract::getBinary(TVar3,Ne);
            if (((BVar6 != BVar7) &&
                (BVar6 = curr->op, BVar7 = Abstract::getBinary(TVar3,LtU), BVar6 != BVar7)) &&
               (BVar6 = curr->op, BVar7 = Abstract::getBinary(TVar3,LeU), BVar6 != BVar7)) {
              BVar6 = curr->op;
              if (IVar10 == inner._4_4_) {
                BVar7 = Abstract::getBinary(TVar3,GtS);
                if ((BVar6 == BVar7) ||
                   (BVar6 = curr->op, BVar7 = Abstract::getBinary(TVar3,GeS), BVar6 == BVar7)) {
                  Literal::makeOne(&local_1e0,(Type)0x2);
                  pEVar11 = getDroppedChildrenAndAppend(pOVar14,(Expression *)curr,&local_1e0);
                  this_00 = &local_1e0;
                }
                else {
                  BVar6 = curr->op;
                  BVar7 = Abstract::getBinary(TVar3,LtS);
                  if ((BVar6 != BVar7) &&
                     (BVar6 = curr->op, BVar7 = Abstract::getBinary(TVar3,LeS), BVar6 != BVar7)) {
                    return (Expression *)0x0;
                  }
                  Literal::makeZero(&local_1c8,(Type)0x2);
                  pEVar11 = getDroppedChildrenAndAppend(pOVar14,(Expression *)curr,&local_1c8);
                  this_00 = &local_1c8;
                }
                goto LAB_009dc50f;
              }
              BVar7 = Abstract::getBinary(TVar3,LtS);
              if ((BVar6 != BVar7) &&
                 (BVar6 = curr->op, BVar7 = Abstract::getBinary(TVar3,LeS), BVar6 != BVar7)) {
                return (Expression *)0x0;
              }
            }
            Literal::makeOne(&local_1f8,(Type)0x2);
            pEVar11 = getDroppedChildrenAndAppend(pOVar14,(Expression *)curr,&local_1f8);
            this_00 = &local_1f8;
          }
LAB_009dc50f:
          Literal::~Literal(this_00);
          return pEVar11;
        }
      }
      return (Expression *)0x0;
    }
    puVar12 = &DAT_00df9190;
  }
  curr->op = *(BinaryOp *)(puVar12 + TVar3.id * 4);
LAB_009dc1d2:
  pEVar11 = *(Expression **)(local_40 + 0x20);
  curr->left = *(Expression **)(local_40 + 0x18);
  curr->right = pEVar11;
  return (Expression *)curr;
}

Assistant:

Expression* optimizeRelational(Binary* curr) {
    using namespace Abstract;
    using namespace Match;

    auto type = curr->right->type;
    if (curr->left->type.isInteger()) {
      if (curr->op == Abstract::getBinary(type, Abstract::Eq) ||
          curr->op == Abstract::getBinary(type, Abstract::Ne)) {
        if (auto* left = curr->left->dynCast<Binary>()) {
          // TODO: inequalities can also work, if the constants do not overflow
          // integer math, even on 2s complement, allows stuff like
          // x + 5 == 7
          //   =>
          //     x == 2
          if (left->op == Abstract::getBinary(type, Abstract::Add)) {
            if (auto* leftConst = left->right->dynCast<Const>()) {
              if (auto* rightConst = curr->right->dynCast<Const>()) {
                return combineRelationalConstants(
                  curr, left, leftConst, nullptr, rightConst);
              } else if (auto* rightBinary = curr->right->dynCast<Binary>()) {
                if (rightBinary->op ==
                    Abstract::getBinary(type, Abstract::Add)) {
                  if (auto* rightConst = rightBinary->right->dynCast<Const>()) {
                    return combineRelationalConstants(
                      curr, left, leftConst, rightBinary, rightConst);
                  }
                }
              }
            }
          }
        }
      }
      // x - y == 0  =>  x == y
      // x - y != 0  =>  x != y
      // unsigned(x - y) > 0    =>   x != y
      // unsigned(x - y) <= 0   =>   x == y
      {
        Binary* inner;
        // unsigned(x - y) > 0    =>   x != y
        if (matches(curr,
                    binary(GtU, binary(&inner, Sub, any(), any()), ival(0)))) {
          curr->op = Abstract::getBinary(type, Ne);
          curr->right = inner->right;
          curr->left = inner->left;
          return curr;
        }
        // unsigned(x - y) <= 0   =>   x == y
        if (matches(curr,
                    binary(LeU, binary(&inner, Sub, any(), any()), ival(0)))) {
          curr->op = Abstract::getBinary(type, Eq);
          curr->right = inner->right;
          curr->left = inner->left;
          return curr;
        }
        // x - y == 0  =>  x == y
        // x - y != 0  =>  x != y
        // This is not true for signed comparisons like x -y < 0 due to overflow
        // effects (e.g. 8 - 0x80000000 < 0 is not the same as 8 < 0x80000000).
        if (matches(curr,
                    binary(Eq, binary(&inner, Sub, any(), any()), ival(0))) ||
            matches(curr,
                    binary(Ne, binary(&inner, Sub, any(), any()), ival(0)))) {
          curr->right = inner->right;
          curr->left = inner->left;
          return curr;
        }
      }

      // x + C1 > C2   ==>  x > (C2-C1)      if no overflowing, C2 >= C1
      // x + C1 > C2   ==>  x + (C1-C2) > 0  if no overflowing, C2 <  C1
      // And similarly for other relational operations on integers with a "+"
      // on the left.
      // TODO: support - and not just +
      {
        Binary* add;
        Const* c1;
        Const* c2;
        if (matches(curr,
                    binary(binary(&add, Add, any(), ival(&c1)), ival(&c2))) &&
            !canOverflow(add, isSignedOp(curr->op))) {
          // We want to subtract C2-C1 or C1-C2. When doing so, we must avoid an
          // overflow in that subtraction (so that we keep all the math here
          // properly linear in the mathematical sense). Overflows that concern
          // us include an underflow with unsigned values (e.g. 10 - 20, which
          // flips the result to a large positive number), and a sign bit
          // overflow for signed values (e.g. 0x80000000 - 1 = 0x7fffffff flips
          // from a negative number, -1, to a positive one). We also need to be
          // careful of signed handling of 0x80000000, for whom 0 - 0x80000000
          // is equal to 0x80000000, leading to
          //   x + 0x80000000 > 0                ;; always false
          // (apply the rule)
          //   x > 0 - 0x80000000 = 0x80000000   ;; depends on x
          // The general principle in all of this is that when we go from
          //   (a)    x + C1 > C2
          // to
          //   (b)    x      > (C2-C1)
          // then we want to adjust both sides in the same (linear) manner. That
          // is, we can write the latter as
          //   (b')   x + 0  > (C2-C1)
          // Comparing (a) and (b'), we want the constants to change in a
          // consistent way: C1 changes to 0, and C2 changes to C2-C1. Both
          // transformations should decrease the value, which is violated in all
          // the overflows described above:
          //   * Unsigned overflow: C1=20, C2=10, then C1 decreases but C2-C1
          //     is larger than C2.
          //   * Sign flip: C1=1, C2=0x80000000, then C1 decreases but C2-C1 is
          //     is larger than C2.
          //   * C1=0x80000000, C2=0, then C1 increases while C2-C1 stays the
          //     same.
          // In the first and second case we can apply the other rule using
          // C1-C2 rather than C2-C1. The third case, however, doesn't even work
          // that way.
          auto C1 = c1->value;
          auto C2 = c2->value;
          auto C1SubC2 = C1.sub(C2);
          auto C2SubC1 = C2.sub(C1);
          auto zero = Literal::makeZero(add->type);
          auto doC1SubC2 = false;
          auto doC2SubC1 = false;
          // Ignore the case of C1 or C2 being zero, as then C2-C1 or C1-C2
          // does not change anything (and we don't want the optimizer to think
          // we improved anything, or we could infinite loop on the mirage of
          // progress).
          if (C1 != zero && C2 != zero) {
            if (isSignedOp(curr->op)) {
              if (C2SubC1.leS(C2).getInteger() && zero.leS(C1).getInteger()) {
                // C2=>C2-C1 and C1=>0 both decrease, which means we can do the
                // rule
                //   (a)    x + C1   > C2
                //   (b')   x (+ 0)  > (C2-C1)
                // That is, subtracting C1 from both sides is ok; the constants
                // on both sides change in the same manner.
                doC2SubC1 = true;
              } else if (C1SubC2.leS(C1).getInteger() &&
                         zero.leS(C2).getInteger()) {
                // N.B. this code path is not tested atm as other optimizations
                // will canonicalize x + C into x - C, and so we would need to
                // implement the TODO above on subtraction and not only support
                // addition here.
                doC1SubC2 = true;
              }
            } else {
              // Unsigned.
              if (C2SubC1.leU(C2).getInteger() && zero.leU(C1).getInteger()) {
                doC2SubC1 = true;
              } else if (C1SubC2.leU(C1).getInteger() &&
                         zero.leU(C2).getInteger()) {
                doC1SubC2 = true;
              }
              // For unsigned, one of the cases must work out, as there are no
              // corner cases with the sign bit.
              assert(doC2SubC1 || doC1SubC2);
            }
          }
          if (doC2SubC1) {
            // This is the first line above, we turn into x > (C2-C1).
            c2->value = C2SubC1;
            curr->left = add->left;
            return curr;
          }
          // This is the second line above, we turn into x + (C1-C2) > 0.
          if (doC1SubC2) {
            c1->value = C1SubC2;
            c2->value = zero;
            return curr;
          }
        }
      }

      // Comparisons can sometimes be simplified depending on the number of
      // bits, e.g.  (unsigned)x > y  must be true if x has strictly more bits.
      // A common case is a constant on the right, e.g. (x & 255) < 256 must be
      // true.
      // TODO: use getMinBits in more places, see ideas in
      //       https://github.com/WebAssembly/binaryen/issues/2898
      {
        // Check if there is a nontrivial amount of bits on the left, which may
        // provide enough to optimize.
        auto leftMaxBits = Bits::getMaxBits(curr->left, this);
        auto type = curr->left->type;
        if (leftMaxBits < getBitsForType(type)) {
          using namespace Abstract;
          auto rightMinBits = Bits::getMinBits(curr->right);
          auto rightIsNegative = rightMinBits == getBitsForType(type);
          if (leftMaxBits < rightMinBits) {
            // There are not enough bits on the left for it to be equal to the
            // right, making various comparisons obviously false:
            //             x == y
            //   (unsigned)x >  y
            //   (unsigned)x >= y
            // and the same for signed, if y does not have the sign bit set
            // (in that case, the comparison is effectively unsigned).
            //
            // TODO: In addition to leftMaxBits < rightMinBits, we could
            //       handle the reverse, and also special cases like all bits
            //       being 1 on the right, things like (x & 255) <= 255  ->  1
            if (curr->op == Abstract::getBinary(type, Eq) ||
                curr->op == Abstract::getBinary(type, GtU) ||
                curr->op == Abstract::getBinary(type, GeU) ||
                (!rightIsNegative &&
                 (curr->op == Abstract::getBinary(type, GtS) ||
                  curr->op == Abstract::getBinary(type, GeS)))) {
              return getDroppedChildrenAndAppend(curr,
                                                 Literal::makeZero(Type::i32));
            }

            // And some are obviously true:
            //             x != y
            //   (unsigned)x <  y
            //   (unsigned)x <= y
            // and likewise for signed, as above.
            if (curr->op == Abstract::getBinary(type, Ne) ||
                curr->op == Abstract::getBinary(type, LtU) ||
                curr->op == Abstract::getBinary(type, LeU) ||
                (!rightIsNegative &&
                 (curr->op == Abstract::getBinary(type, LtS) ||
                  curr->op == Abstract::getBinary(type, LeS)))) {
              return getDroppedChildrenAndAppend(curr,
                                                 Literal::makeOne(Type::i32));
            }

            // For truly signed comparisons, where y's sign bit is set, we can
            // also infer some things, since we know y is signed but x is not
            // (since x does not have enough bits for the sign bit to be set).
            if (rightIsNegative) {
              //   (signed, non-negative)x >  (negative)y   =>   1
              //   (signed, non-negative)x >= (negative)y   =>   1
              if (curr->op == Abstract::getBinary(type, GtS) ||
                  curr->op == Abstract::getBinary(type, GeS)) {
                return getDroppedChildrenAndAppend(curr,
                                                   Literal::makeOne(Type::i32));
              }
              //   (signed, non-negative)x <  (negative)y   =>   0
              //   (signed, non-negative)x <= (negative)y   =>   0
              if (curr->op == Abstract::getBinary(type, LtS) ||
                  curr->op == Abstract::getBinary(type, LeS)) {
                return getDroppedChildrenAndAppend(
                  curr, Literal::makeZero(Type::i32));
              }
            }
          }
        }
      }
    }
    return nullptr;
  }